

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.h
# Opt level: O2

void boundSize(QSizeF *result,QSizeF *size)

{
  double dVar1;
  
  dVar1 = size->wd;
  if ((0.0 <= dVar1) && (dVar1 < result->wd)) {
    result->wd = dVar1;
  }
  dVar1 = size->ht;
  if ((0.0 <= dVar1) && (dVar1 < result->ht)) {
    result->ht = dVar1;
  }
  return;
}

Assistant:

constexpr inline qreal QSizeF::height() const noexcept
{ return ht; }